

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall cab_provision_simple::test_method(cab_provision_simple *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  unit_test_log_t *this_01;
  bool bVar1;
  element_type *this_02;
  lazy_ostream *prev;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_168;
  undefined4 local_148;
  id_type local_144;
  undefined1 local_13d [5];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_138;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  undefined1 local_f8 [8];
  shared_ptr<cab> c;
  node_type dst;
  node_type src;
  weak_ptr<cab_session> local_d8;
  undefined1 local_c8 [8];
  shared_ptr<cab_session> session;
  cab_manager manager;
  cab_provision_simple *this_local;
  
  this_00 = &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cab_manager::cab_manager((cab_manager *)this_00);
  std::shared_ptr<cab_session>::shared_ptr((shared_ptr<cab_session> *)local_c8,(nullptr_t)0x0);
  std::weak_ptr<cab_session>::weak_ptr<cab_session,void>
            (&local_d8,(shared_ptr<cab_session> *)local_c8);
  cab_manager::create((cab_manager *)this_00,&local_d8);
  std::weak_ptr<cab_session>::~weak_ptr(&local_d8);
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 2;
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_1_ = 0xb;
  cab_manager::find_cab((cab_manager *)local_f8,(char)&session + P3,P0,0xb);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_01,&local_108,299,&local_118);
    this_02 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_f8);
    local_144 = cab::id(this_02);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_13d + 1),(uint *)local_13d);
    local_148 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_138,(int *)(local_13d + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
    ::evaluate(&local_130,&local_138,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,"c->id() == 0",0xc);
    boost::unit_test::operator<<(&local_168,prev,&local_178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_168.super_lazy_ostream,&local_188,299,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_168);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)local_f8);
  std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_c8);
  cab_manager::~cab_manager
            ((cab_manager *)
             &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_simple)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;

    manager.create(session);

    node_type src = node_type::P0;
    node_type dst = node_type::P5;

    std::shared_ptr<cab> c = manager.find_cab(src, dst, 1);
    BOOST_TEST(c->id() == 0);
}